

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastReplace
          (Lowerer *this,Opnd *strOpnd,Opnd *src1,Opnd *src2,Instr *callInstr,Instr *insertInstr,
          LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  IndirOpnd *compareSrc1;
  BailOutInfo *bailoutInfo;
  bool local_69;
  Instr *local_60;
  Instr *helperCallInstr;
  Opnd *local_50;
  Opnd *vtableOpnd;
  Opnd *local_40;
  Opnd *callDst;
  Instr *insertInstr_local;
  Instr *callInstr_local;
  Opnd *src2_local;
  Opnd *src1_local;
  Opnd *strOpnd_local;
  Lowerer *this_local;
  
  callDst = (Opnd *)insertInstr;
  insertInstr_local = callInstr;
  callInstr_local = (Instr *)src2;
  src2_local = src1;
  src1_local = strOpnd;
  strOpnd_local = (Opnd *)this;
  local_40 = IR::Instr::GetDst(callInstr);
  vtableOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(src1_local);
  bVar2 = ValueType::IsLikelyString((ValueType *)((long)&vtableOpnd + 6));
  local_69 = false;
  if (bVar2) {
    vtableOpnd._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)callInstr_local);
    local_69 = ValueType::IsLikelyString((ValueType *)((long)&vtableOpnd + 4));
  }
  if (((local_69 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4fcf,
                       "(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString())"
                       ,
                       "strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  vtableOpnd._2_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(src1_local);
  bVar2 = ValueType::IsString((ValueType *)((long)&vtableOpnd + 2));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    src1_local = &GetRegOpnd(this,src1_local,(Instr *)callDst,this->m_func,TyVar)->super_Opnd;
    pRVar5 = IR::Opnd::AsRegOpnd(src1_local);
    GenerateStringTest(this,pRVar5,(Instr *)callDst,labelHelper,(LabelInstr *)0x0,true);
  }
  bVar2 = IR::Opnd::IsNotTaggedValue(src2_local);
  if (!bVar2) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,src2_local,(Instr *)callDst,labelHelper,false);
  }
  local_50 = LoadVTableValueOpnd(this,(Instr *)callDst,VtableJavascriptRegExp);
  src2_local = &GetRegOpnd(this,src2_local,(Instr *)callDst,this->m_func,TyVar)->super_Opnd;
  pRVar5 = IR::Opnd::AsRegOpnd(src2_local);
  compareSrc1 = IR::IndirOpnd::New(pRVar5,0,TyUint64,(Func *)callDst[2]._vptr_Opnd,false);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,local_50,BrNeq_A,labelHelper,(Instr *)callDst,
                      false);
  helperCallInstr._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType((Opnd *)callInstr_local);
  bVar2 = ValueType::IsString((ValueType *)((long)&helperCallInstr + 6));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    callInstr_local =
         (Instr *)GetRegOpnd(this,(Opnd *)callInstr_local,(Instr *)callDst,this->m_func,TyVar);
    pRVar5 = IR::Opnd::AsRegOpnd((Opnd *)callInstr_local);
    GenerateStringTest(this,pRVar5,(Instr *)callDst,labelHelper,(LabelInstr *)0x0,true);
  }
  local_60 = IR::Instr::New(CALL,(Func *)callDst[2]._vptr_Opnd);
  if (local_40 != (Opnd *)0x0) {
    IR::Instr::SetDst(local_60,local_40);
  }
  IR::Instr::InsertBefore((Instr *)callDst,local_60);
  bVar2 = IR::Instr::HasBailOutInfo((Instr *)callDst);
  if (bVar2) {
    BVar3 = IR::Instr::GetBailOutKind((Instr *)callDst);
    bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
    if (bVar2) {
      bailoutInfo = IR::Instr::GetBailOutInfo((Instr *)callDst);
      BVar3 = IR::Instr::GetBailOutKind((Instr *)callDst);
      local_60 = AddBailoutToHelperCallInstr(this,local_60,bailoutInfo,BVar3,(Instr *)callDst);
    }
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,local_60,(Opnd *)callInstr_local);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,local_60,src1_local);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,local_60,src2_local);
  LoadScriptContext(this,local_60);
  if (local_40 == (Opnd *)0x0) {
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,local_60,HelperRegExp_ReplaceStringResultNotUsed,(LabelInstr *)0x0
               ,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  else {
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,local_60,HelperRegExp_ReplaceStringResultUsed,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastReplace(IR::Opnd* strOpnd, IR::Opnd* src1, IR::Opnd* src2, IR::Instr *callInstr, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // strOpnd --> a
    // src1    --> b
    // src2    --> c

    IR::Opnd * callDst = callInstr->GetDst();

    Assert(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString());

    if(!strOpnd->GetValueType().IsString())
    {
        strOpnd = GetRegOpnd(strOpnd, insertInstr, m_func, TyVar);

        this->GenerateStringTest(strOpnd->AsRegOpnd(), insertInstr, labelHelper);
    }

    if(!src1->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src1, insertInstr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    src1 = GetRegOpnd(src1, insertInstr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(src1->AsRegOpnd(), 0, TyMachPtr, insertInstr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        insertInstr);

    if(!src2->GetValueType().IsString())
    {
        src2 = GetRegOpnd(src2, insertInstr, m_func, TyVar);
        this->GenerateStringTest(src2->AsRegOpnd(), insertInstr, labelHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, insertInstr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    insertInstr->InsertBefore(helperCallInstr);

    if (insertInstr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(insertInstr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, insertInstr->GetBailOutInfo(), insertInstr->GetBailOutKind(), insertInstr);
    }

    //scriptContext, pRegEx, pThis, pReplace (to be pushed in reverse order)

    // pReplace, pThis, pRegEx
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src2);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, strOpnd);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src1);

    // script context
    LoadScriptContext(helperCallInstr);

    if(callDst)
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultUsed);
    }
    else
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultNotUsed);
    }

    return true;
}